

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receiver_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Receiver_PDU::Decode(Receiver_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x23 < iVar2 + (uint)KVar1) {
    Radio_Communications_Header::Decode
              (&this->super_Radio_Communications_Header,stream,ignoreHeader);
    KDataStream::Read<unsigned_short>
              (stream,(unsigned_short *)&(this->super_Radio_Communications_Header).field_0x3a);
    KDataStream::Read<unsigned_short>
              (stream,(unsigned_short *)&(this->super_Radio_Communications_Header).field_0x3c);
    KDataStream::Read<float>(stream,(float *)&this->m_f32RecPwr);
    (*(this->m_TransmitterEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase
      [3])(&this->m_TransmitterEntityID,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16TransmitterRadioID);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Receiver_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < RECEIVER_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Radio_Communications_Header::Decode( stream, ignoreHeader );

    stream >> m_ui16ReceiverState
           >> m_ui16Padding1
           >> m_f32RecPwr
           >> KDIS_STREAM m_TransmitterEntityID
           >> m_ui16TransmitterRadioID;
}